

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpCompressionState<float>::CreateEmptySegment
          (AlpCompressionState<float> *this,idx_t row_start)

{
  DatabaseInstance *segment_size;
  BlockManager *other;
  BufferManager *pBVar1;
  pointer pCVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  idx_t in_RSI;
  LogicalType *in_RDI;
  CompressionFunction *unaff_retaddr;
  DatabaseInstance *in_stack_00000008;
  BlockManager *in_stack_00000020;
  BufferManager *buffer_manager;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  LogicalType *type;
  DatabaseInstance *db;
  BufferHandle *in_stack_fffffffffffffef0;
  undefined1 local_58 [40];
  BufferManager *local_30;
  LogicalType *local_20;
  LogicalType *type_00;
  
  type_00 = in_RDI;
  segment_size = ColumnDataCheckpointData::GetDatabase((ColumnDataCheckpointData *)0x9f87d0);
  local_20 = ColumnDataCheckpointData::GetType((ColumnDataCheckpointData *)0x9f87ec);
  CompressionInfo::GetBlockSize((CompressionInfo *)0x9f8843);
  other = CompressionInfo::GetBlockManager((CompressionInfo *)&in_RDI->type_info_);
  ColumnSegment::CreateTransientSegment
            (in_stack_00000008,unaff_retaddr,type_00,in_RSI,(idx_t)segment_size,in_stack_00000020);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator=
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             in_stack_fffffffffffffef0,
             (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             other);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             in_stack_fffffffffffffef0);
  pBVar1 = BufferManager::GetBufferManager((DatabaseInstance *)0x9f88e1);
  local_30 = pBVar1;
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_fffffffffffffef0);
  (*pBVar1->_vptr_BufferManager[7])(local_58,pBVar1,&pCVar2->block);
  BufferHandle::operator=(in_stack_fffffffffffffef0,(BufferHandle *)other);
  BufferHandle::~BufferHandle(in_stack_fffffffffffffef0);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0x9f8975);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_fffffffffffffef0);
  iVar4 = ColumnSegment::GetBlockOffset(pCVar2);
  *(data_ptr_t *)(in_RDI + 4) = pdVar3 + iVar4 + 4;
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0x9f89c9);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_fffffffffffffef0);
  iVar4 = ColumnSegment::GetBlockOffset(pCVar2);
  pdVar3 = pdVar3 + iVar4;
  iVar4 = CompressionInfo::GetBlockSize((CompressionInfo *)0x9f8a1c);
  in_RDI[4].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(pdVar3 + iVar4);
  *(undefined4 *)
   &in_RDI[4].type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 4;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0x9f8a50);
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		current_segment = std::move(compressed_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(current_segment->db);
		handle = buffer_manager.Pin(current_segment->block);

		// The pointer to the start of the compressed data.
		data_ptr = handle.Ptr() + current_segment->GetBlockOffset() + AlpConstants::HEADER_SIZE;
		// The pointer to the start of the metadata.
		metadata_ptr = handle.Ptr() + current_segment->GetBlockOffset() + info.GetBlockSize();
		next_vector_byte_index_start = AlpConstants::HEADER_SIZE;
	}